

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O3

void setupTestEnvironment(Setup *s,long round)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  u32 uVar4;
  int i;
  long lVar5;
  
  s->round = round;
  s->supervisor = (bool)((byte)round & 1);
  iVar2 = rand();
  s->ccr = (u8)iVar2;
  iVar2 = Randomizer::rand((Randomizer *)&randomizer);
  s->ext1 = (u16)iVar2;
  iVar2 = Randomizer::rand((Randomizer *)&randomizer);
  s->ext2 = (u16)iVar2;
  iVar2 = Randomizer::rand((Randomizer *)&randomizer);
  s->ext3 = (u16)iVar2;
  if (cpuModel == M68000) {
    uVar1 = 0;
  }
  else {
    iVar2 = Randomizer::rand((Randomizer *)&randomizer);
    uVar1 = (ushort)iVar2 & 0xfffe;
  }
  s->vbr = uVar1;
  iVar2 = Randomizer::rand((Randomizer *)&randomizer);
  s->sfc = (u16)iVar2;
  iVar2 = Randomizer::rand((Randomizer *)&randomizer);
  s->dfc = (u16)iVar2;
  uVar3 = Randomizer::rand((Randomizer *)&randomizer);
  uVar4 = moira::Moira::cacrMask(&moiracpu->super_Moira);
  s->cacr = uVar4 & uVar3;
  uVar4 = Randomizer::rand((Randomizer *)&randomizer);
  s->caar = uVar4;
  lVar5 = 0;
  do {
    uVar4 = Randomizer::rand((Randomizer *)&randomizer);
    s->d[lVar5] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  lVar5 = 0;
  do {
    uVar4 = Randomizer::rand((Randomizer *)&randomizer);
    s->a[lVar5] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  lVar5 = 0;
  do {
    iVar2 = Randomizer::rand((Randomizer *)&randomizer);
    s->mem[lVar5] = (u8)iVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10000);
  return;
}

Assistant:

void setupTestEnvironment(Setup &s, long round)
{
    s.round = round;
    s.supervisor = round % 2;
    s.ccr = u8(rand());
    s.ext1 = u16(randomizer.rand());
    s.ext2 = u16(randomizer.rand());
    s.ext3 = u16(randomizer.rand());
    s.vbr = cpuModel == Model::M68000 ? 0 : u16(randomizer.rand() & ~1);
    s.sfc = u16(randomizer.rand());
    s.dfc = u16(randomizer.rand());
    s.cacr = randomizer.rand() & moiracpu->cacrMask();
    s.caar = randomizer.rand();

    for (int i = 0; i < 8; i++) s.d[i] = randomizer.rand();
    for (int i = 0; i < 8; i++) s.a[i] = randomizer.rand();

    for (unsigned i = 0; i < sizeof(s.mem); i++) {
        s.mem[i] = u8(randomizer.rand());
    }
}